

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O2

void __thiscall Debugger::SetHookState(Debugger *this,shared_ptr<HookState> *newState)

{
  lua_State *plVar1;
  element_type *peVar2;
  int iVar3;
  __shared_ptr<Debugger,(__gnu_cxx::_Lock_policy)2> a_Stack_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2> local_48;
  
  plVar1 = this->currentL;
  if (plVar1 != (lua_State *)0x0) {
    local_48._M_ptr = (element_type *)0x0;
    local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->hookState).super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>,
               &local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    peVar2 = (newState->super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_ptr<Debugger,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Debugger,void>
              (a_Stack_58,(__weak_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2> *)this);
    iVar3 = (*peVar2->_vptr_HookState[2])(peVar2,a_Stack_58,plVar1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
    if ((char)iVar3 != '\0') {
      std::__shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->hookState).super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>,
                 &newState->super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>);
    }
  }
  return;
}

Assistant:

void Debugger::SetHookState(std::shared_ptr<HookState> newState) {
	if (!currentL) {
		return;
	}

	auto L = currentL;

	hookState = nullptr;
	if (newState->Start(shared_from_this(), L)) {
		hookState = newState;
	}
}